

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckComments.cxx
# Opt level: O0

bool __thiscall
kws::Parser::CheckComments
          (Parser *this,char *begin,char *middle,char *end,bool allowEmptyLineBeforeClass,
          bool checkWrongComment,bool checkMissingComment)

{
  string *psVar1;
  bool bVar2;
  reference ppVar3;
  string *psVar4;
  string *psVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  reference pcVar8;
  char *pcVar9;
  long lVar10;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  Error error_3;
  string sub;
  size_t poscombegt;
  size_t poscombeg;
  Error error_2;
  size_t i_1;
  bool gotchar;
  bool emptyLine;
  Error error_1;
  size_t poscomtemp;
  size_t poscom;
  char j;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  string commentEnd;
  size_t poswithcom;
  size_t pos;
  Error error;
  string word;
  bool first;
  bool inWord;
  size_t i;
  string previousWord;
  const_iterator it;
  bool hasError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  value_type *in_stack_fffffffffffffc38;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc4f;
  size_t in_stack_fffffffffffffc50;
  Parser *in_stack_fffffffffffffc58;
  Parser *in_stack_fffffffffffffc60;
  byte local_309;
  string *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  Parser *in_stack_fffffffffffffd48;
  undefined1 local_289 [33];
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *local_268;
  undefined8 local_260;
  undefined8 local_258;
  string local_250 [32];
  string local_230 [32];
  ulong local_210;
  ulong local_208;
  size_t local_200;
  size_t local_1f8;
  undefined8 local_1f0;
  string local_1e8 [32];
  ulong local_1c8;
  byte local_1ba;
  byte local_1b9;
  long local_1b8;
  long local_1b0;
  undefined8 local_1a8;
  string local_1a0 [32];
  ulong local_180;
  ulong local_178;
  char local_169;
  undefined8 local_168;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  long local_158;
  allocator local_149;
  string local_148 [32];
  size_t local_128;
  allocator local_119;
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  pair<unsigned_long,_unsigned_long> *local_f0;
  long local_e8;
  long local_e0;
  undefined8 local_d8;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [38];
  byte local_82;
  byte local_81;
  string *local_80;
  undefined1 local_61 [33];
  pair<unsigned_long,_unsigned_long> *local_40;
  pair<unsigned_long,_unsigned_long> *local_38;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_30;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_21 = (bool)(in_R8B & 1);
  local_22 = (bool)(in_R9B & 1);
  local_23 = (bool)(in_stack_00000008 & 1);
  local_24 = false;
  if (local_22 != false) {
    *(undefined1 *)(in_RDI + 0x43) = 1;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x2b8),"The comments are misspelled");
    std::__cxx11::string::operator=((string *)(in_RDI + 0x5c8),local_10);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x5e8),local_18);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x608),local_20);
    local_38 = (pair<unsigned_long,_unsigned_long> *)
               std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        *)in_stack_fffffffffffffc28);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
    ::__normal_iterator<std::pair<unsigned_long,unsigned_long>*>
              ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                *)in_stack_fffffffffffffc30,
               (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                *)in_stack_fffffffffffffc28);
    while( true ) {
      local_40 = (pair<unsigned_long,_unsigned_long> *)
                 std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        *)in_stack_fffffffffffffc28);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                          *)in_stack_fffffffffffffc30,
                         (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                          *)in_stack_fffffffffffffc28);
      if (!bVar2) break;
      in_stack_fffffffffffffd48 = (Parser *)local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_61 + 1),"",(allocator *)in_stack_fffffffffffffd48);
      std::allocator<char>::~allocator((allocator<char> *)local_61);
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::operator*(&local_30);
      local_80 = (string *)ppVar3->first;
      while( true ) {
        in_stack_fffffffffffffd38 = local_80;
        psVar4 = (string *)std::__cxx11::string::size();
        psVar1 = local_80;
        in_stack_fffffffffffffd47 = false;
        if (in_stack_fffffffffffffd38 < psVar4) {
          ppVar3 = __gnu_cxx::
                   __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                   ::operator*(&local_30);
          in_stack_fffffffffffffd47 = psVar1 < (string *)ppVar3->second;
        }
        if ((bool)in_stack_fffffffffffffd47 == false) break;
        while( true ) {
          psVar1 = local_80;
          psVar4 = (string *)std::__cxx11::string::size();
          bVar2 = false;
          if (psVar1 < psVar4) {
            pcVar9 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
            bVar2 = false;
            if (*pcVar9 != ' ') {
              pcVar9 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
              bVar2 = false;
              if (*pcVar9 != '\r') {
                pcVar9 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
                psVar1 = local_80;
                bVar2 = false;
                if (*pcVar9 != '\r') {
                  ppVar3 = __gnu_cxx::
                           __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                           ::operator*(&local_30);
                  bVar2 = psVar1 < (string *)ppVar3->second;
                }
              }
            }
          }
          if (!bVar2) break;
          local_80 = (string *)&local_80->field_0x1;
        }
        local_81 = 1;
        local_82 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"",&local_a9);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        while( true ) {
          psVar1 = local_80;
          psVar5 = (string *)std::__cxx11::string::size();
          psVar4 = local_80;
          local_309 = 0;
          if (psVar1 < psVar5) {
            ppVar3 = __gnu_cxx::
                     __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                     ::operator*(&local_30);
            local_309 = 0;
            if (psVar4 < (string *)ppVar3->second) {
              local_309 = local_81;
            }
          }
          if ((local_309 & 1) == 0) break;
          pcVar9 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
          if (((*pcVar9 == ' ') ||
              (pcVar9 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8), *pcVar9 == '\r'))
             || (pcVar9 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8), *pcVar9 == '\n')
             ) {
            if ((local_82 & 1) != 0) {
              local_81 = 0;
              local_80 = (string *)(local_80[-1].field_2._M_local_buf + 0xf);
            }
          }
          else {
            pcVar9 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
            std::__cxx11::string::operator+=(local_a8,*pcVar9);
            local_81 = 1;
            local_82 = 1;
          }
          local_80 = (string *)&local_80->field_0x1;
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          bVar2 = std::operator!=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          if (bVar2) {
            std::__cxx11::string::operator=((string *)(local_61 + 1),local_a8);
          }
          else {
            uVar6 = std::__cxx11::string::size();
            if ((((1 < uVar6) &&
                 (pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)(local_61 + 1)),
                 *pcVar9 != '/')) &&
                (pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)(local_61 + 1)),
                *pcVar9 < '0')) &&
               (pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)(local_61 + 1)),
               '9' < *pcVar9)) {
              ErrorStruct::ErrorStruct((ErrorStruct *)0x1aeca9);
              local_e8 = GetLineNumber(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                                       (bool)in_stack_fffffffffffffc4f);
              local_d8 = 0x13;
              local_e0 = local_e8;
              std::__cxx11::string::operator=(local_d0,"Duplicate word: ");
              std::__cxx11::string::operator+=(local_d0,(string *)(local_61 + 1));
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
              local_24 = true;
              ErrorStruct::~ErrorStruct((ErrorStruct *)0x1aed49);
            }
          }
        }
        std::__cxx11::string::~string(local_a8);
      }
      local_f0 = (pair<unsigned_long,_unsigned_long> *)
                 __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                 ::operator++((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                               *)in_stack_fffffffffffffc38,
                              (int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
      std::__cxx11::string::~string((string *)(local_61 + 1));
    }
  }
  if ((local_23 & 1U) != 0) {
    *(undefined1 *)(in_RDI + 0x44) = 1;
    std::__cxx11::string::operator=
              ((string *)(in_RDI + 0x2d8),
               "The class should have previously defined comments starting with \\class");
    if ((local_21 & 1U) == 0) {
      std::__cxx11::string::operator+=((string *)(in_RDI + 0x2d8)," (not allowing empty line)");
    }
    else {
      std::__cxx11::string::operator+=((string *)(in_RDI + 0x2d8)," (allowing empty line)");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"",&local_119);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             GetClassPosition(in_stack_fffffffffffffd48,
                              CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                              in_stack_fffffffffffffd38);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    local_f8 = pbVar7;
    while (local_f8 !=
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff)
    {
      local_128 = GetPositionWithComments
                            (in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"",&local_149);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      local_158 = in_RDI + 0x608;
      local_160._M_current = (char *)std::__cxx11::string::begin();
      local_168 = std::__cxx11::string::end();
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffc30,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffc28), bVar2) {
        pcVar8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_160);
        local_169 = *pcVar8;
        if (local_169 != ' ') {
          std::__cxx11::string::operator+=(local_148,local_169);
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_160);
      }
      local_180 = std::__cxx11::string::find((string *)(in_RDI + 0x4f8),(ulong)local_148);
      local_178 = local_180;
      while (local_180 != 0xffffffffffffffff && local_180 < local_128) {
        local_178 = local_180;
        local_180 = std::__cxx11::string::find((string *)(in_RDI + 0x4f8),(ulong)local_148);
      }
      if ((local_178 == 0xffffffffffffffff) || (local_128 < local_178)) {
        ErrorStruct::ErrorStruct((ErrorStruct *)0x1af13c);
        local_1b8 = GetLineNumber(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                                  (bool)in_stack_fffffffffffffc4f);
        local_1a8 = 0x14;
        local_1b0 = local_1b8;
        std::__cxx11::string::operator=(local_1a0,"Comment is missing for the class");
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        local_24 = true;
        ErrorStruct::~ErrorStruct((ErrorStruct *)0x1af1c5);
      }
      else {
        local_1b9 = 0;
        local_1ba = 1;
        for (local_1c8 = local_178; local_1c8 < local_128; local_1c8 = local_1c8 + 1) {
          pcVar9 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
          if (*pcVar9 == '\n') {
            if ((local_1ba & 1) == 0) {
              local_1b9 = 1;
              break;
            }
            local_1ba = 0;
          }
          pcVar9 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
          if (((*pcVar9 != '\n') &&
              (in_stack_fffffffffffffc60 =
                    (Parser *)std::__cxx11::string::operator[](in_RDI + 0x4f8),
              *(char *)&(in_stack_fffffffffffffc60->m_ErrorList).
                        super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                        _M_impl.super__Vector_impl_data._M_start != '\r')) &&
             (in_stack_fffffffffffffc58 = (Parser *)std::__cxx11::string::operator[](in_RDI + 0x4f8)
             , *(char *)&(in_stack_fffffffffffffc58->m_ErrorList).
                         super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                         _M_impl.super__Vector_impl_data._M_start != ' ')) {
            local_1ba = 1;
          }
        }
        if ((local_1b9 & 1) == 0) {
          local_210 = std::__cxx11::string::find((string *)(in_RDI + 0x4f8),in_RDI + 0x5c8);
          local_208 = local_210;
          while (in_stack_fffffffffffffc4f =
                      local_210 != 0xffffffffffffffff && local_210 < local_178,
                local_210 != 0xffffffffffffffff && local_210 < local_178) {
            local_208 = local_210;
            local_210 = std::__cxx11::string::find((string *)(in_RDI + 0x4f8),in_RDI + 0x5c8);
          }
          if ((local_208 != 0xffffffffffffffff) && (local_178 != local_208)) {
            std::__cxx11::string::substr((ulong)local_230,in_RDI + 0x4f8);
            lVar10 = std::__cxx11::string::find((char *)local_230,0x1e6101);
            if (lVar10 == -1) {
              ErrorStruct::ErrorStruct((ErrorStruct *)0x1af540);
              in_stack_fffffffffffffc40 =
                   (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                   GetLineNumber(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                                 (bool)in_stack_fffffffffffffc4f);
              local_258 = 0x14;
              local_268 = in_stack_fffffffffffffc40;
              local_260 = in_stack_fffffffffffffc40;
              std::__cxx11::string::operator=(local_250,"comment doesn\'t have \\class");
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
              local_24 = true;
              ErrorStruct::~ErrorStruct((ErrorStruct *)0x1af5c9);
            }
            std::__cxx11::string::~string(local_230);
          }
        }
        else if ((local_21 & 1U) == 0) {
          ErrorStruct::ErrorStruct((ErrorStruct *)0x1af351);
          in_stack_fffffffffffffc50 =
               GetLineNumber(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                             (bool)in_stack_fffffffffffffc4f);
          local_1f0 = 0x14;
          local_200 = in_stack_fffffffffffffc50;
          local_1f8 = in_stack_fffffffffffffc50;
          std::__cxx11::string::operator=(local_1e8,"Comment is missing for the class");
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
          local_24 = true;
          ErrorStruct::~ErrorStruct((ErrorStruct *)0x1af3da);
        }
      }
      in_stack_fffffffffffffc30 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8->field_0x1
      ;
      in_stack_fffffffffffffc38 = (value_type *)local_289;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_289 + 1),"",(allocator *)in_stack_fffffffffffffc38);
      in_stack_fffffffffffffc28 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           GetClassPosition(in_stack_fffffffffffffd48,
                            CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                            in_stack_fffffffffffffd38);
      local_f8 = in_stack_fffffffffffffc28;
      std::__cxx11::string::~string((string *)(local_289 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_289);
      std::__cxx11::string::~string(local_148);
    }
  }
  return (bool)((local_24 ^ 0xffU) & 1);
}

Assistant:

bool Parser::CheckComments(const char* begin,const char* middle,const char* end,
                           bool allowEmptyLineBeforeClass,
                           bool checkWrongComment,
                           bool checkMissingComment)
{
  bool hasError = false;
    
  if(checkWrongComment)
    {
    m_TestsDone[WRONGCOMMENT] = true;
    m_TestsDescription[WRONGCOMMENT] = "The comments are misspelled";
    
    // Set the ivars for the indent checking
    m_CommentBegin = begin;
    m_CommentMiddle = middle;
    m_CommentEnd = end;

    // We check if we have duplicate code in the comments
    std::vector<PairType>::const_iterator it = m_CommentPositions.begin();
    while(it != m_CommentPositions.end())
      {
      std::string previousWord = "";
      size_t i = (*it).first;
      while((i<m_Buffer.size()) && i<(*it).second)
        {    
        // we go to the next space
        while((i<m_Buffer.size()) && ((m_Buffer[i] != ' ') && (m_Buffer[i] != '\r') && (m_Buffer[i] != '\r')) && i<(*it).second)
          {
          i++;
          }
        bool inWord = true;
        bool first = false;
        std::string word = "";
        
        while((i<m_Buffer.size()) && i<(*it).second && inWord)
          {
          if(m_Buffer[i] != ' ' && m_Buffer[i] != '\r' && m_Buffer[i] != '\n')
            {
            word += m_Buffer[i];
            inWord = true;
            first = true;
            }
          else // we have a space
            {
            if(first)
              {
              inWord = false;
              i--;
              }
            }
          i++;
          }

          if (!word.empty()) {
            if (word != previousWord) {
              previousWord = word;
            }
          else if(previousWord.size() > 1 && 
               previousWord[0] != '/'
               && previousWord[0]<48 && previousWord[0]>57 // We check if the first word is not a number
               ) // avoid single char and comment
            {
            Error error;
            error.line = this->GetLineNumber(i,false);
            error.line2 = error.line;
            error.number = WRONGCOMMENT;
            error.description = "Duplicate word: ";
            error.description += previousWord;
            m_ErrorList.push_back(error);
            hasError = true;
            }
          }
        }
      it++;
      } // end buffer loop
    }

  if(checkMissingComment)
    {
    // Check if there is a comment before each class
    m_TestsDone[MISSINGCOMMENT] = true;
    m_TestsDescription[MISSINGCOMMENT] = "The class should have previously defined comments starting with \\class";

    if(allowEmptyLineBeforeClass)
      {
      m_TestsDescription[MISSINGCOMMENT] += " (allowing empty line)";
      }
    else
      {
      m_TestsDescription[MISSINGCOMMENT] += " (not allowing empty line)";
      }

   size_t pos = this->GetClassPosition(0);
   while(pos != std::string::npos)
     {
     size_t poswithcom = this->GetPositionWithComments(pos);

     // Find the last comment (remove spaces if any)
     std::string commentEnd = "";
     for (char j : m_CommentEnd) {
       if (j != ' ') {
         commentEnd += j;
       }
     }

     size_t poscom = m_Buffer.find(commentEnd,0);
     size_t poscomtemp = poscom;
     while(poscomtemp!=std::string::npos && poscomtemp<poswithcom)
       {
       poscom = poscomtemp;
       poscomtemp = m_Buffer.find(commentEnd,poscomtemp+1);
       }

     // if we don't have the comment
     if((poscom == std::string::npos) || (poscom > poswithcom))
       {
       Error error;
       error.line = this->GetLineNumber(poswithcom,false);
       error.line2 = error.line;
       error.number = MISSINGCOMMENT;
       error.description = "Comment is missing for the class";
       m_ErrorList.push_back(error);
       hasError = true;
       }
     else
       {
       // We check if we have m_CommentEnd before an empty line
       bool emptyLine = false;
       bool gotchar = true;
       for(size_t i=poscom;i<poswithcom;i++)
         {
         if(m_Buffer[i] == '\n')
           {
           if(!gotchar)
             {
             emptyLine = true;
             break;
             }
           gotchar = false;
           }

         if( (m_Buffer[i] != '\n') 
           && (m_Buffer[i] != '\r') 
           && (m_Buffer[i] != ' '))
           {
           gotchar = true;
           }   
         }

       if(emptyLine)
         {
         if(!allowEmptyLineBeforeClass)
           {
           Error error;
           error.line = this->GetLineNumber(poswithcom,false);
           error.line2 = error.line;
           error.number = MISSINGCOMMENT;
           error.description = "Comment is missing for the class";
           m_ErrorList.push_back(error);
           hasError = true;
           }
         }
       else  // we check that the word \class exists
         {
         // Find the last 
         size_t poscombeg = m_Buffer.find(m_CommentBegin,0);
         size_t poscombegt = poscombeg;
         while(poscombegt!=std::string::npos && poscombegt<poscom)
           {
           poscombeg = poscombegt;
           poscombegt = m_Buffer.find(m_CommentBegin,poscombegt+1);
           }

         if(poscombeg!=std::string::npos && (poscom-poscombeg>0))
           {
           std::string sub = m_Buffer.substr(poscombeg,poscom-poscombeg);
           if(sub.find("\\class") == std::string::npos)
             {
             Error error;
             error.line = this->GetLineNumber(poswithcom,false);
             error.line2 = error.line;
             error.number = MISSINGCOMMENT;
             error.description = "comment doesn't have \\class";
             m_ErrorList.push_back(error);
             hasError = true;
             }
           }
         }
       }
     pos = this->GetClassPosition(pos+1);
     }
   } // end check missing comments
  return !hasError;
}